

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_skipMisc(Parser *xmlParser)

{
  char **pstrSrc;
  char *__s1;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *strSkipKey;
  
  pstrSrc = &xmlParser->curPtr;
  do {
    __s1 = *pstrSrc;
    iVar2 = strncasecmp(__s1,"<!--",4);
    if (iVar2 == 0) {
      iVar2 = Parser_skipComment(pstrSrc);
LAB_001275b8:
      bVar1 = true;
    }
    else {
      iVar3 = strncasecmp(__s1,"<?xml ",6);
      bVar1 = true;
      iVar2 = 0xc;
      if (iVar3 != 0) {
        iVar3 = strncasecmp(__s1,"<?xml?",6);
        if (iVar3 != 0) {
          strSkipKey = "<?";
          iVar3 = strncasecmp(__s1,"<?",2);
          iVar2 = 0;
          bVar1 = false;
          if (iVar3 == 0) {
            iVar2 = Parser_skipString(pstrSrc,strSkipKey);
            goto LAB_001275b8;
          }
        }
      }
    }
    Parser_skipWhiteSpaces(xmlParser);
    if ((!bVar1) || (iVar2 != 0)) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int Parser_skipMisc(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	int rc = IXML_SUCCESS;
	int done = 0;

	while ((done == 0) && (rc == IXML_SUCCESS)) {
		if (strncasecmp(xmlParser->curPtr,
			    BEGIN_COMMENT,
			    strlen(BEGIN_COMMENT)) == 0) {
			/* <!-- */
			rc = Parser_skipComment(&(xmlParser->curPtr));

		} else if (strncasecmp(xmlParser->curPtr,
				   XMLDECL,
				   strlen(XMLDECL)) == 0 ||
			   strncasecmp(xmlParser->curPtr,
				   XMLDECL2,
				   strlen(XMLDECL2)) == 0) {
			/* <?xml or <?xml? */
			rc = IXML_SYNTAX_ERR;
		} else if (strncasecmp(xmlParser->curPtr,
				   BEGIN_PI,
				   strlen(BEGIN_PI)) == 0) {
			/* <? */
			rc = Parser_skipString(&xmlParser->curPtr, END_PI);
		} else {
			done = 1;
		}
		Parser_skipWhiteSpaces(xmlParser);
	}

	return rc;
}